

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsMemoryStressCase.cpp
# Opt level: O0

void __thiscall deqp::gls::BufferRenderer::render(BufferRenderer *this,deUint32 buffer,int size)

{
  deUint32 dVar1;
  GLenum GVar2;
  deBool dVar3;
  GLuint index;
  GLuint index_00;
  TestError *pTVar4;
  deUint32 coordLoc;
  deUint32 bufferLoc;
  int size_local;
  deUint32 buffer_local;
  BufferRenderer *this_local;
  
  do {
    dVar1 = glu::ShaderProgram::getProgram(this->m_program);
    glwUseProgram(dVar1);
    GVar2 = glwGetError();
    glu::checkError(GVar2,"glUseProgram(m_program->getProgram())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                    ,0x182);
    dVar3 = ::deGetFalse();
  } while (dVar3 != 0);
  dVar1 = glu::ShaderProgram::getProgram(this->m_program);
  index = glwGetAttribLocation(dVar1,"a_buffer");
  while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (index != 0xffffffff))) {
    dVar3 = ::deGetFalse();
    if (dVar3 == 0) {
      dVar1 = glu::ShaderProgram::getProgram(this->m_program);
      index_00 = glwGetAttribLocation(dVar1,"a_coord");
      while ((dVar3 = ::deGetFalse(), dVar3 == 0 && (index_00 != 0xffffffff))) {
        dVar3 = ::deGetFalse();
        if (dVar3 == 0) {
          dVar1 = this->m_vao;
          while (dVar1 != 0) {
            glwBindVertexArray(this->m_vao);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindVertexArray(m_vao)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x18b);
            dVar1 = ::deGetFalse();
          }
          do {
            glwEnableVertexAttribArray(index);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glEnableVertexAttribArray(bufferLoc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x18d);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwEnableVertexAttribArray(index_00);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glEnableVertexAttribArray(coordLoc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x18e);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwBindBuffer(0x8892,this->m_coordBuffer);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,400);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwVertexAttribPointer(index_00,2,0x1406,'\0',0,(void *)0x0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x191);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwBindBuffer(0x8892,buffer);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindBuffer(GL_ARRAY_BUFFER, buffer)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x193);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwVertexAttribPointer(index,4,0x1401,'\x01',0,(void *)0x0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,
                            "glVertexAttribPointer(bufferLoc, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x194);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwBindBuffer(0x8892,0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindBuffer(GL_ARRAY_BUFFER, 0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x195);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwBindBuffer(0x8893,this->m_indexBuffer);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x197);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwDrawElements(4,6,0x1401,(void *)0x0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x198);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwDisableVertexAttribArray(index);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glDisableVertexAttribArray(bufferLoc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x19a);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          do {
            glwDisableVertexAttribArray(index_00);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glDisableVertexAttribArray(coordLoc)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x19b);
            dVar3 = ::deGetFalse();
          } while (dVar3 != 0);
          dVar1 = this->m_vao;
          while (dVar1 != 0) {
            glwBindVertexArray(0);
            GVar2 = glwGetError();
            glu::checkError(GVar2,"glBindVertexArray(0)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                            ,0x19e);
            dVar1 = ::deGetFalse();
          }
          return;
        }
      }
      pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
      tcu::TestError::TestError
                (pTVar4,(char *)0x0,"coordLoc != (deUint32)-1",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
                 ,0x188);
      __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
    }
  }
  pTVar4 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (pTVar4,(char *)0x0,"bufferLoc != (deUint32)-1",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/glshared/glsMemoryStressCase.cpp"
             ,0x185);
  __cxa_throw(pTVar4,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
}

Assistant:

void BufferRenderer::render (deUint32 buffer, int size)
{
	DE_UNREF(size);
	DE_ASSERT((size_t)size >= sizeof(GLubyte) * 4 * 6);
	GLU_CHECK_CALL(glUseProgram(m_program->getProgram()));

	deUint32 bufferLoc = glGetAttribLocation(m_program->getProgram(), "a_buffer");
	TCU_CHECK(bufferLoc != (deUint32)-1);

	deUint32 coordLoc = glGetAttribLocation(m_program->getProgram(), "a_coord");
	TCU_CHECK(coordLoc != (deUint32)-1);

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(m_vao));

	GLU_CHECK_CALL(glEnableVertexAttribArray(bufferLoc));
	GLU_CHECK_CALL(glEnableVertexAttribArray(coordLoc));

	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, m_coordBuffer));
	GLU_CHECK_CALL(glVertexAttribPointer(coordLoc, 2, GL_FLOAT, GL_FALSE, 0, NULL));

	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, buffer));
	GLU_CHECK_CALL(glVertexAttribPointer(bufferLoc, 4, GL_UNSIGNED_BYTE, GL_TRUE, 0, 0));
	GLU_CHECK_CALL(glBindBuffer(GL_ARRAY_BUFFER, 0));

	GLU_CHECK_CALL(glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer));
	GLU_CHECK_CALL(glDrawElements(GL_TRIANGLES, 6, GL_UNSIGNED_BYTE, NULL));

	GLU_CHECK_CALL(glDisableVertexAttribArray(bufferLoc));
	GLU_CHECK_CALL(glDisableVertexAttribArray(coordLoc));

	if (m_vao != 0)
		GLU_CHECK_CALL(glBindVertexArray(0));
}